

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

void Internal_SplitFaceSwapFacePtr(ON_SubDFace *f,ON__UINT_PTR *pairA,ON__UINT_PTR *pairB)

{
  unsigned_short uVar1;
  short sVar2;
  ushort uVar3;
  long lVar4;
  ON__UINT_PTR OVar5;
  ON__UINT_PTR OVar6;
  ulong *puVar7;
  ON_SubDEdge *edge;
  ulong uVar8;
  unsigned_short uVar9;
  ON_SubDEdgePtr *pOVar10;
  ulong uVar11;
  ulong *puVar12;
  short sVar13;
  ulong uVar14;
  
  if (f != (ON_SubDFace *)0x0) {
    if (((*pairA == *pairB) || (pairA[1] == *pairB)) || (*pairA == pairB[1] || pairA[1] == pairB[1])
       ) {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                 ,0x47d2,"","pairA[] and pairB[] must be disjoint sets of values.");
      return;
    }
    uVar1 = f->m_edge_count;
    if (uVar1 != 0) {
      pOVar10 = f->m_edge4;
      uVar9 = 0;
      do {
        if ((uVar9 == 4) && (pOVar10 = f->m_edgex, pOVar10 == (ON_SubDEdgePtr *)0x0)) {
          return;
        }
        uVar14 = pOVar10->m_ptr;
        uVar8 = uVar14 & 0xfffffffffffffff8;
        if (uVar8 != 0) {
          sVar2 = *(short *)(uVar8 + 100);
          if (sVar2 != 0) {
            puVar7 = (ulong *)(uVar8 + 0x68);
            sVar13 = 0;
            do {
              if ((sVar13 == 2) && (puVar7 = *(ulong **)(uVar8 + 0x78), puVar7 == (ulong *)0x0))
              break;
              uVar11 = *puVar7 & 0xfffffffffffffff8;
              puVar12 = pairA + 1;
              if ((uVar11 == *pairA) || (puVar12 = pairB + 1, uVar11 == *pairB)) {
                *puVar7 = (ulong)((uint)*puVar7 & 1) | *puVar12;
              }
              sVar13 = sVar13 + 1;
              puVar7 = puVar7 + 1;
            } while (sVar2 != sVar13);
          }
          lVar4 = *(long *)(uVar8 + 0x80 + (ulong)((uint)uVar14 & 1) * 8);
          if (((lVar4 != 0) && (*(long *)(lVar4 + 0x78) != 0)) &&
             (uVar3 = *(ushort *)(lVar4 + 0x6a), (ulong)uVar3 != 0)) {
            OVar5 = *pairA;
            uVar14 = 0;
            do {
              OVar6 = *(ON__UINT_PTR *)(*(long *)(lVar4 + 0x78) + uVar14 * 8);
              puVar7 = pairA + 1;
              if ((OVar5 == OVar6) || (puVar7 = pairB + 1, *pairB == OVar6)) {
                *(ulong *)(*(long *)(lVar4 + 0x78) + uVar14 * 8) = *puVar7;
              }
              uVar14 = uVar14 + 1;
            } while (uVar3 != uVar14);
          }
        }
        uVar9 = uVar9 + 1;
        pOVar10 = pOVar10 + 1;
      } while (uVar9 != uVar1);
    }
  }
  return;
}

Assistant:

static void Internal_SplitFaceSwapFacePtr(
  ON_SubDFace* f,
  ON__UINT_PTR pairA[2],
  ON__UINT_PTR pairB[2]
  )
{
  if (nullptr == f)
    return;

  if (pairA[0] == pairB[0] || pairA[1] == pairB[0] || pairA[0] == pairB[1] || pairA[1] == pairB[1])
  {
    ON_SUBD_ERROR("pairA[] and pairB[] must be disjoint sets of values.");
    return;
  }

  ON_SubDEdgePtr* feptr = f->m_edge4;
  for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++feptr)
  {
    if (4 == fei)
    {
      feptr = f->m_edgex;
      if (nullptr == feptr)
        break;
    }

    ON_SubDEdge* fe = ON_SUBD_EDGE_POINTER(feptr->m_ptr);
    if (nullptr == fe)
      continue;

    ON_SubDFacePtr* efptr = fe->m_face2;
    for (unsigned short efi = 0; efi < fe->m_face_count; ++efi, ++efptr)
    {
      if (2 == efi)
      {
        efptr = fe->m_facex;
        if (nullptr == efptr)
          break;
      }
      const ON__UINT_PTR x = (efptr->m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
      const ON__UINT_PTR d = (efptr->m_ptr & ON_SUBD_COMPONENT_DIRECTION_MASK);
      if (x == pairA[0])
        efptr->m_ptr = (pairA[1] | d);
      else if (x == pairB[0])
        efptr->m_ptr = (pairB[1] | d);
    }


    ON_SubDVertex* v = const_cast<ON_SubDVertex*>(feptr->RelativeVertex(0));
    if (nullptr != v && nullptr != v->m_faces)
    {
      for (unsigned short vfi = 0; vfi < v->m_face_count; ++vfi)
      {
        const ON__UINT_PTR x = (ON__UINT_PTR)v->m_faces[vfi];
        if (x == pairA[0])
          v->m_faces[vfi] = (ON_SubDFace*)pairA[1];
        else if (x == pairB[0])
          v->m_faces[vfi] = (ON_SubDFace*)pairB[1];
      }
    }
  }
}